

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwio.c
# Opt level: O3

void png_default_write_data(png_structp png_ptr,png_bytep data,png_size_t length)

{
  size_t sVar1;
  
  if (png_ptr != (png_structp)0x0) {
    sVar1 = fwrite(data,1,length,(FILE *)png_ptr->io_ptr);
    if (sVar1 != length) {
      png_error(png_ptr,"Write Error");
    }
  }
  return;
}

Assistant:

void PNGCBAPI
png_default_write_data(png_structp png_ptr, png_bytep data, png_size_t length)
{
   png_size_t check;

   if (png_ptr == NULL)
      return;

   check = fwrite(data, 1, length, (png_FILE_p)(png_ptr->io_ptr));

   if (check != length)
      png_error(png_ptr, "Write Error");
}